

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*>::
emplaceRealloc<slang::ast::MethodPrototypeSymbol_const*>
          (SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*> *this,pointer pos,
          MethodPrototypeSymbol **args)

{
  pointer ppMVar1;
  ulong uVar2;
  long lVar3;
  pointer __dest;
  size_t __n;
  pointer __src;
  pointer __dest_00;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar3 = *(long *)this;
  __dest = (pointer)detail::allocArray(capacity,8);
  ppMVar1 = (pointer)((long)__dest + ((long)pos - lVar3));
  *(MethodPrototypeSymbol **)((long)__dest + ((long)pos - lVar3)) = *args;
  __src = *(pointer *)this;
  lVar3 = *(long *)(this + 8);
  if (__src + lVar3 == pos) {
    if (lVar3 == 0) goto LAB_00229b03;
    __n = lVar3 << 3;
    __dest_00 = __dest;
  }
  else {
    if (__src != pos) {
      memmove(__dest,__src,(long)pos - (long)__src);
    }
    __n = (*(long *)(this + 8) * 8 + *(long *)this) - (long)pos;
    if (__n == 0) goto LAB_00229b03;
    __src = pos;
    __dest_00 = ppMVar1 + 1;
  }
  memmove(__dest_00,__src,__n);
LAB_00229b03:
  if (*(SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*> **)this != this + 0x18) {
    free(*(SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(pointer *)this = __dest;
  return ppMVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}